

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprIsAlnum(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal)

{
  int iVar1;
  byte local_48 [8];
  u8 aArr [32];
  int iCode;
  sqlite3_value **apVal_local;
  int nArg_local;
  sqlite3_context *pCtx_local;
  
  if (nArg == 1) {
    memset(local_48,0,0x20);
    sqlite3Fts5UnicodeCatParse("L*",local_48);
    sqlite3Fts5UnicodeCatParse("N*",local_48);
    sqlite3Fts5UnicodeCatParse("Co",local_48);
    aArr._28_4_ = sqlite3_value_int(*apVal);
    iVar1 = sqlite3Fts5UnicodeCategory(aArr._28_4_);
    sqlite3_result_int(pCtx,(uint)local_48[iVar1]);
  }
  else {
    sqlite3_result_error(pCtx,"wrong number of arguments to function fts5_isalnum",-1);
  }
  return;
}

Assistant:

static void fts5ExprIsAlnum(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apVal           /* Function arguments */
){
  int iCode;
  u8 aArr[32];
  if( nArg!=1 ){
    sqlite3_result_error(pCtx, 
        "wrong number of arguments to function fts5_isalnum", -1
    );
    return;
  }
  memset(aArr, 0, sizeof(aArr));
  sqlite3Fts5UnicodeCatParse("L*", aArr);
  sqlite3Fts5UnicodeCatParse("N*", aArr);
  sqlite3Fts5UnicodeCatParse("Co", aArr);
  iCode = sqlite3_value_int(apVal[0]);
  sqlite3_result_int(pCtx, aArr[sqlite3Fts5UnicodeCategory((u32)iCode)]);
}